

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O2

void kv_get_var_nentry_test(void)

{
  int iVar1;
  size_t sVar2;
  bnode *pbVar3;
  char *pcVar4;
  void **ppvVar5;
  void *pvVar6;
  undefined8 *puVar7;
  long lVar8;
  btree_kv_ops local_118;
  undefined8 uStack_a0;
  undefined1 local_98 [8];
  timeval __test_begin;
  void *vars [2];
  void *local_40;
  void *k_out;
  uint8_t v_out;
  uint8_t v;
  
  uStack_a0 = 0x10242e;
  gettimeofday((timeval *)local_98,(__timezone_ptr_t)0x0);
  uStack_a0 = 0x102433;
  memleak_start();
  local_40 = (void *)0x0;
  puVar7 = &DAT_00108d70;
  for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 8) {
    pcVar4 = *(char **)((long)&DAT_00108d70 + lVar8);
    uStack_a0 = 0x102451;
    sVar2 = strlen(pcVar4);
    uStack_a0 = 0x102466;
    construct_key_ptr(pcVar4,(short)sVar2 + 1,(void *)((long)vars + lVar8 + 8));
  }
  uStack_a0 = 0x102479;
  pbVar3 = dummy_node('\t','\x01',1);
  pbVar3->nentry = 6;
  k_out._7_1_ = 'd';
  btree_str_kv_get_kb64_vb64(&local_118);
  ppvVar5 = vars;
  for (lVar8 = 0; ppvVar5 = ppvVar5 + 1, lVar8 != 6; lVar8 = lVar8 + 1) {
    (*local_118.set_kv)(pbVar3,(idx_t)lVar8,ppvVar5,(void *)((long)&k_out + 7));
    k_out._7_1_ = k_out._7_1_ + '\x01';
  }
  k_out._7_1_ = 'd';
  pvVar6 = (void *)0x0;
  lVar8 = 0;
  while( true ) {
    if (lVar8 == 6) {
      __test_begin.tv_usec = (__suseconds_t)pbVar3;
      vars[0] = pvVar6;
      freevars((void **)&__test_begin.tv_usec,2);
      freevars(vars + 1,6);
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (kv_get_var_nentry_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar4,"kv_get_var_nentry_test");
      return;
    }
    (*local_118.get_kv)(pbVar3,(idx_t)lVar8,&local_40,(void *)((long)&k_out + 6));
    pvVar6 = local_40;
    iVar1 = strcmp((char *)((long)local_40 + 2),(char *)*puVar7);
    if (iVar1 != 0) break;
    if (k_out._6_1_ != k_out._7_1_) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
              ,0x215);
      kv_get_var_nentry_test()::__test_pass = 1;
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x215,"void kv_get_var_nentry_test()");
    }
    k_out._7_1_ = k_out._6_1_ + '\x01';
    lVar8 = lVar8 + 1;
    puVar7 = puVar7 + 1;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
          ,0x213);
  kv_get_var_nentry_test()::__test_pass = 1;
  __assert_fail("cmp == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                ,0x213,"void kv_get_var_nentry_test()");
}

Assistant:

void kv_get_var_nentry_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v, v_out;
    idx_t idx;
    int cmp, i;
    void *k_out = NULL;

    const char *keys[] = {"string",
                          "longstring",
                          "longerstring",
                          "",
                          "123231234242423428492342",
                          "string with space"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
    }

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // set n keys
    for (idx = 0; idx < n; idx ++){
        kv_ops->set_kv(node, idx, &key_ptrs[idx], (void *)&v);
        v++;
    }

    // get n keys
    v = 100;
    for (idx = 0; idx < n; idx ++){
        kv_ops->get_kv(node, idx, &k_out, (void *)&v_out);
        char *node_str = (char *)((uint8_t *)k_out + sizeof(key_len_t));
        cmp = strcmp(node_str, keys[idx]);
        TEST_CHK(cmp == 0);
        cmp = memcmp(&v_out, &v, vsize);
        TEST_CHK(cmp == 0);
        v++;
    }


    void *vars[] = {(void *)node, k_out};
    freevars(vars, sizeof(vars)/sizeof(void *));
    freevars(key_ptrs, n);
    memleak_end();
    TEST_RESULT("kv_get_var_nentry_test");
}